

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool Fossilize::write_string_to_file(char *path,char *text)

{
  int iVar1;
  FILE *__stream;
  FILE *file;
  char *text_local;
  char *path_local;
  
  __stream = fopen(path,"w");
  if (__stream == (FILE *)0x0) {
    path_local._7_1_ = false;
  }
  else {
    iVar1 = fputs(text,__stream);
    if (iVar1 == -1) {
      fclose(__stream);
      path_local._7_1_ = false;
    }
    else {
      fclose(__stream);
      path_local._7_1_ = true;
    }
  }
  return path_local._7_1_;
}

Assistant:

bool write_string_to_file(const char *path, const char *text)
{
	FILE *file = fopen(path, "w");
	if (!file)
		return false;

	if (fputs(text, file) == EOF)
	{
		fclose(file);
		return false;
	}

	fclose(file);
	return true;
}